

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JsonLibTests_Unmarshall.c
# Opt level: O2

WJTL_STATUS TestUnmarshallLists(void)

{
  uint32_t uVar1;
  size_t sVar2;
  JL_STATUS JVar3;
  JL_STATUS JVar4;
  JL_STATUS JVar5;
  JL_STATUS JVar6;
  long lVar7;
  undefined8 *puVar8;
  JlMarshallElement *pJVar9;
  WJTL_STATUS WVar10;
  bool Condition;
  bool Condition_00;
  bool Condition_01;
  bool Condition_02;
  bool Condition_03;
  bool Condition_04;
  bool Condition_05;
  bool Condition_06;
  bool Condition_07;
  bool Condition_08;
  bool Condition_09;
  bool Condition_10;
  bool Condition_11;
  bool Condition_12;
  bool Condition_13;
  bool Condition_14;
  bool Condition_15;
  bool Condition_16;
  bool Condition_17;
  bool Condition_18;
  bool Condition_19;
  bool Condition_20;
  bool Condition_21;
  bool Condition_22;
  bool Condition_23;
  bool Condition_24;
  bool Condition_25;
  bool Condition_26;
  bool Condition_27;
  bool Condition_28;
  bool Condition_29;
  bool Condition_30;
  bool Condition_31;
  bool Condition_32;
  bool Condition_33;
  bool Condition_34;
  bool Condition_35;
  bool Condition_36;
  bool Condition_37;
  bool Condition_38;
  bool Condition_39;
  bool Condition_40;
  bool Condition_41;
  bool Condition_42;
  bool Condition_43;
  bool Condition_44;
  bool Condition_45;
  bool Condition_46;
  bool Condition_47;
  bool Condition_48;
  bool Condition_49;
  size_t errorAtPos;
  TheStruct theStruct;
  JlMarshallElement marshalTheStruct [2];
  JlMarshallElement marshalSubSubStruct [1];
  JlMarshallElement marshalSubStruct [2];
  
  errorAtPos = 0;
  puVar8 = &DAT_00141770;
  pJVar9 = marshalSubSubStruct;
  for (lVar7 = 0xc; lVar7 != 0; lVar7 = lVar7 + -1) {
    *(undefined8 *)pJVar9 = *puVar8;
    puVar8 = puVar8 + 1;
    pJVar9 = (JlMarshallElement *)&pJVar9->Name;
  }
  marshalTheStruct[0].ChildStructDescription = marshalSubStruct;
  marshalTheStruct[0].Type = JL_DATA_TYPE_DICTIONARY;
  marshalSubStruct[0].Name = "SubSubFixList";
  marshalSubStruct[0].IsArray = true;
  marshalSubStruct[0].FieldOffset = 0;
  marshalSubStruct[0].FieldSize = 0x10;
  marshalSubStruct[0].CountFieldOffset = 0x10;
  marshalSubStruct[0].CountFieldSize = 8;
  marshalSubStruct[0].ArrayFieldSize = 0x10;
  marshalSubStruct[0].ArrayItemSize = 4;
  marshalSubStruct[0].NumberType = JL_NUM_TYPE_NONE;
  marshalSubStruct[0].IsHex = false;
  marshalSubStruct[0].IsBase64 = false;
  marshalSubStruct[0].ChildStructDescriptionCount = 1;
  marshalSubStruct[1].Name = "SubSubVarList";
  marshalSubStruct[1].IsArray = true;
  marshalSubStruct[1].FieldOffset = 0x18;
  marshalSubStruct[1].FieldSize = 8;
  marshalSubStruct[1].CountFieldOffset = 0x20;
  marshalSubStruct[1].CountFieldSize = 8;
  marshalSubStruct[1].ArrayFieldSize = 0;
  marshalSubStruct[1].ArrayItemSize = 4;
  marshalSubStruct[1].NumberType = JL_NUM_TYPE_NONE;
  marshalTheStruct[0].Name = "SubFixList";
  marshalTheStruct[0].IsArray = true;
  marshalTheStruct[0].FieldOffset = 0;
  marshalTheStruct[0].FieldSize = 0xa0;
  marshalTheStruct[0].CountFieldOffset = 0xa0;
  marshalTheStruct[0].CountFieldSize = 8;
  marshalTheStruct[0].ArrayFieldSize = 0xa0;
  marshalTheStruct[0].ArrayItemSize = 0x28;
  marshalTheStruct[0].NumberType = JL_NUM_TYPE_NONE;
  marshalTheStruct[0].IsHex = false;
  marshalTheStruct[0].IsBase64 = false;
  marshalTheStruct[0].ChildStructDescriptionCount = 2;
  marshalTheStruct[1].Name = "SubVarList";
  marshalTheStruct[1].IsArray = true;
  marshalTheStruct[1].FieldOffset = 0xa8;
  marshalTheStruct[1].FieldSize = 8;
  marshalTheStruct[1].CountFieldOffset = 0xb0;
  marshalSubStruct[1].IsHex = false;
  marshalSubStruct[1].IsBase64 = false;
  marshalTheStruct[1].CountFieldSize = 8;
  marshalTheStruct[1].ArrayFieldSize = 0;
  marshalTheStruct[1].ArrayItemSize = 0x28;
  marshalTheStruct[1].NumberType = JL_NUM_TYPE_NONE;
  marshalTheStruct[1].IsHex = false;
  marshalTheStruct[1].IsBase64 = false;
  marshalTheStruct[1].Type = marshalTheStruct[0].Type;
  marshalTheStruct[1].ChildStructDescription = marshalTheStruct[0].ChildStructDescription;
  marshalTheStruct[1].ChildStructDescriptionCount = marshalTheStruct[0].ChildStructDescriptionCount;
  marshalSubStruct[0].Type = marshalTheStruct[0].Type;
  marshalSubStruct[0].ChildStructDescription = marshalSubSubStruct;
  marshalSubStruct[1].Type = marshalTheStruct[0].Type;
  marshalSubStruct[1].ChildStructDescription = marshalSubSubStruct;
  marshalSubStruct[1].ChildStructDescriptionCount = marshalSubStruct[0].ChildStructDescriptionCount;
  memset(&theStruct,0,0xb8);
  JVar3 = JlJsonToStruct("{  \"SubFixList\":[     { \"SubSubFixList\": [{\"Num\":1},{\"Num\":2}], \"SubSubVarList\": [{\"Num\":3},{\"Num\":4}] },    { \"SubSubFixList\": [{\"Num\":5},{\"Num\":6}], \"SubSubVarList\": [{\"Num\":7},{\"Num\":8}] }  ],  \"SubVarList\":[     { \"SubSubFixList\": [{\"Num\":9},{\"Num\":10}], \"SubSubVarList\": [{\"Num\":11},{\"Num\":12}] },    { \"SubSubFixList\": [{\"Num\":13},{\"Num\":14}], \"SubSubVarList\": [{\"Num\":15},{\"Num\":16}] }  ]}"
                         ,marshalTheStruct,2,&theStruct,&errorAtPos);
  WjTestLib_Assert(JVar3 == JL_STATUS_SUCCESS,
                   "((JL_STATUS)(JlJsonToStruct( \"{\" \"  \\\"SubFixList\\\":[ \" \"    { \\\"SubSubFixList\\\": [{\\\"Num\\\":1},{\\\"Num\\\":2}], \\\"SubSubVarList\\\": [{\\\"Num\\\":3},{\\\"Num\\\":4}] },\" \"    { \\\"SubSubFixList\\\": [{\\\"Num\\\":5},{\\\"Num\\\":6}], \\\"SubSubVarList\\\": [{\\\"Num\\\":7},{\\\"Num\\\":8}] }\" \"  ],\" \"  \\\"SubVarList\\\":[ \" \"    { \\\"SubSubFixList\\\": [{\\\"Num\\\":9},{\\\"Num\\\":10}], \\\"SubSubVarList\\\": [{\\\"Num\\\":11},{\\\"Num\\\":12}] },\" \"    { \\\"SubSubFixList\\\": [{\\\"Num\\\":13},{\\\"Num\\\":14}], \\\"SubSubVarList\\\": [{\\\"Num\\\":15},{\\\"Num\\\":16}] }\" \"  ]\" \"}\", marshalTheStruct, ( sizeof(marshalTheStruct) / sizeof((marshalTheStruct)[0]) ), &theStruct, &errorAtPos ))) == (JL_STATUS_SUCCESS)"
                   ,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Unmarshall.c"
                   ,"TestUnmarshallLists",0x5fb);
  Condition = errorAtPos == 0;
  WjTestLib_Assert(Condition,"0 == errorAtPos",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Unmarshall.c"
                   ,"TestUnmarshallLists",0x5fd);
  Condition_00 = theStruct.SubFixListCount == 2;
  WjTestLib_Assert(Condition_00,"2 == theStruct.SubFixListCount",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Unmarshall.c"
                   ,"TestUnmarshallLists",0x5fe);
  Condition_01 = theStruct.SubFixList[0].SubSubFixListCount == 2;
  WjTestLib_Assert(Condition_01,"2 == theStruct.SubFixList[0].SubSubFixListCount",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Unmarshall.c"
                   ,"TestUnmarshallLists",0x5ff);
  Condition_02 = theStruct.SubFixList[0].SubSubFixList[0].Num == 1;
  WjTestLib_Assert(Condition_02,"1 == theStruct.SubFixList[0].SubSubFixList[0].Num",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Unmarshall.c"
                   ,"TestUnmarshallLists",0x600);
  Condition_03 = theStruct.SubFixList[0].SubSubFixList[1].Num == 2;
  WjTestLib_Assert(Condition_03,"2 == theStruct.SubFixList[0].SubSubFixList[1].Num",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Unmarshall.c"
                   ,"TestUnmarshallLists",0x601);
  Condition_04 = theStruct.SubFixList[0].SubSubVarListCount == 2;
  WjTestLib_Assert(Condition_04,"2 == theStruct.SubFixList[0].SubSubVarListCount",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Unmarshall.c"
                   ,"TestUnmarshallLists",0x602);
  Condition_05 = (theStruct.SubFixList[0].SubSubVarList)->Num == 3;
  WjTestLib_Assert(Condition_05,"3 == theStruct.SubFixList[0].SubSubVarList[0].Num",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Unmarshall.c"
                   ,"TestUnmarshallLists",0x603);
  Condition_06 = theStruct.SubFixList[0].SubSubVarList[1].Num == 4;
  WjTestLib_Assert(Condition_06,"4 == theStruct.SubFixList[0].SubSubVarList[1].Num",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Unmarshall.c"
                   ,"TestUnmarshallLists",0x604);
  Condition_07 = theStruct.SubFixList[1].SubSubFixListCount == 2;
  WjTestLib_Assert(Condition_07,"2 == theStruct.SubFixList[1].SubSubFixListCount",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Unmarshall.c"
                   ,"TestUnmarshallLists",0x605);
  Condition_08 = theStruct.SubFixList[1].SubSubFixList[0].Num == 5;
  WjTestLib_Assert(Condition_08,"5 == theStruct.SubFixList[1].SubSubFixList[0].Num",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Unmarshall.c"
                   ,"TestUnmarshallLists",0x606);
  Condition_09 = theStruct.SubFixList[1].SubSubFixList[1].Num == 6;
  WjTestLib_Assert(Condition_09,"6 == theStruct.SubFixList[1].SubSubFixList[1].Num",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Unmarshall.c"
                   ,"TestUnmarshallLists",0x607);
  Condition_10 = theStruct.SubFixList[1].SubSubVarListCount == 2;
  WjTestLib_Assert(Condition_10,"2 == theStruct.SubFixList[1].SubSubVarListCount",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Unmarshall.c"
                   ,"TestUnmarshallLists",0x608);
  Condition_11 = (theStruct.SubFixList[1].SubSubVarList)->Num == 7;
  WjTestLib_Assert(Condition_11,"7 == theStruct.SubFixList[1].SubSubVarList[0].Num",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Unmarshall.c"
                   ,"TestUnmarshallLists",0x609);
  Condition_12 = theStruct.SubFixList[1].SubSubVarList[1].Num == 8;
  WjTestLib_Assert(Condition_12,"8 == theStruct.SubFixList[1].SubSubVarList[1].Num",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Unmarshall.c"
                   ,"TestUnmarshallLists",0x60a);
  Condition_13 = (theStruct.SubVarList)->SubSubFixListCount == 2;
  WjTestLib_Assert(Condition_13,"2 == theStruct.SubVarList[0].SubSubFixListCount",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Unmarshall.c"
                   ,"TestUnmarshallLists",0x60c);
  Condition_14 = (theStruct.SubVarList)->SubSubFixList[0].Num == 9;
  WjTestLib_Assert(Condition_14,"9 == theStruct.SubVarList[0].SubSubFixList[0].Num",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Unmarshall.c"
                   ,"TestUnmarshallLists",0x60d);
  Condition_15 = (theStruct.SubVarList)->SubSubFixList[1].Num == 10;
  WjTestLib_Assert(Condition_15,"10 == theStruct.SubVarList[0].SubSubFixList[1].Num",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Unmarshall.c"
                   ,"TestUnmarshallLists",0x60e);
  Condition_16 = (theStruct.SubVarList)->SubSubVarListCount == 2;
  WjTestLib_Assert(Condition_16,"2 == theStruct.SubVarList[0].SubSubVarListCount",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Unmarshall.c"
                   ,"TestUnmarshallLists",0x60f);
  Condition_17 = (theStruct.SubVarList)->SubSubVarList->Num == 0xb;
  WjTestLib_Assert(Condition_17,"11 == theStruct.SubVarList[0].SubSubVarList[0].Num",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Unmarshall.c"
                   ,"TestUnmarshallLists",0x610);
  Condition_18 = (theStruct.SubVarList)->SubSubVarList[1].Num == 0xc;
  WjTestLib_Assert(Condition_18,"12 == theStruct.SubVarList[0].SubSubVarList[1].Num",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Unmarshall.c"
                   ,"TestUnmarshallLists",0x611);
  Condition_19 = theStruct.SubVarList[1].SubSubFixListCount == 2;
  WjTestLib_Assert(Condition_19,"2 == theStruct.SubVarList[1].SubSubFixListCount",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Unmarshall.c"
                   ,"TestUnmarshallLists",0x612);
  Condition_20 = theStruct.SubVarList[1].SubSubFixList[0].Num == 0xd;
  WjTestLib_Assert(Condition_20,"13 == theStruct.SubVarList[1].SubSubFixList[0].Num",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Unmarshall.c"
                   ,"TestUnmarshallLists",0x613);
  Condition_21 = theStruct.SubVarList[1].SubSubFixList[1].Num == 0xe;
  WjTestLib_Assert(Condition_21,"14 == theStruct.SubVarList[1].SubSubFixList[1].Num",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Unmarshall.c"
                   ,"TestUnmarshallLists",0x614);
  Condition_22 = theStruct.SubVarList[1].SubSubVarListCount == 2;
  WjTestLib_Assert(Condition_22,"2 == theStruct.SubVarList[1].SubSubVarListCount",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Unmarshall.c"
                   ,"TestUnmarshallLists",0x615);
  Condition_23 = (theStruct.SubVarList[1].SubSubVarList)->Num == 0xf;
  WjTestLib_Assert(Condition_23,"15 == theStruct.SubVarList[1].SubSubVarList[0].Num",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Unmarshall.c"
                   ,"TestUnmarshallLists",0x616);
  Condition_24 = theStruct.SubVarList[1].SubSubVarList[1].Num == 0x10;
  WjTestLib_Assert(Condition_24,"16 == theStruct.SubVarList[1].SubSubVarList[1].Num",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Unmarshall.c"
                   ,"TestUnmarshallLists",0x617);
  JVar4 = JlJsonToStruct("{  \"SubFixList\":[     { \"SubSubFixList\": [{\"Num\":41},{\"Num\":42}], \"SubSubVarList\": [{\"Num\":43},{\"Num\":44}] },    { \"SubSubFixList\": [{\"Num\":45},{\"Num\":46}], \"SubSubVarList\": [{\"Num\":47},{\"Num\":48}] }  ]}"
                         ,marshalTheStruct,2,&theStruct,&errorAtPos);
  WjTestLib_Assert(JVar4 == JL_STATUS_SUCCESS,
                   "((JL_STATUS)(JlJsonToStruct( \"{\" \"  \\\"SubFixList\\\":[ \" \"    { \\\"SubSubFixList\\\": [{\\\"Num\\\":41},{\\\"Num\\\":42}], \\\"SubSubVarList\\\": [{\\\"Num\\\":43},{\\\"Num\\\":44}] },\" \"    { \\\"SubSubFixList\\\": [{\\\"Num\\\":45},{\\\"Num\\\":46}], \\\"SubSubVarList\\\": [{\\\"Num\\\":47},{\\\"Num\\\":48}] }\" \"  ]\" \"}\", marshalTheStruct, ( sizeof(marshalTheStruct) / sizeof((marshalTheStruct)[0]) ), &theStruct, &errorAtPos ))) == (JL_STATUS_SUCCESS)"
                   ,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Unmarshall.c"
                   ,"TestUnmarshallLists",0x621);
  Condition_25 = errorAtPos == 0;
  WjTestLib_Assert(Condition_25,"0 == errorAtPos",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Unmarshall.c"
                   ,"TestUnmarshallLists",0x623);
  Condition_26 = theStruct.SubFixListCount == 2;
  WjTestLib_Assert(Condition_26,"2 == theStruct.SubFixListCount",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Unmarshall.c"
                   ,"TestUnmarshallLists",0x624);
  Condition_27 = theStruct.SubFixList[0].SubSubFixListCount == 2;
  WjTestLib_Assert(Condition_27,"2 == theStruct.SubFixList[0].SubSubFixListCount",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Unmarshall.c"
                   ,"TestUnmarshallLists",0x625);
  Condition_28 = theStruct.SubFixList[0].SubSubFixList[0].Num == 0x29;
  WjTestLib_Assert(Condition_28,"41 == theStruct.SubFixList[0].SubSubFixList[0].Num",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Unmarshall.c"
                   ,"TestUnmarshallLists",0x626);
  WjTestLib_Assert(theStruct.SubFixList[0].SubSubFixList[1].Num == 0x2a,
                   "42 == theStruct.SubFixList[0].SubSubFixList[1].Num",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Unmarshall.c"
                   ,"TestUnmarshallLists",0x627);
  Condition_29 = theStruct.SubFixList[0].SubSubVarListCount == 2;
  WjTestLib_Assert(Condition_29,"2 == theStruct.SubFixList[0].SubSubVarListCount",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Unmarshall.c"
                   ,"TestUnmarshallLists",0x628);
  Condition_30 = (theStruct.SubFixList[0].SubSubVarList)->Num == 0x2b;
  WjTestLib_Assert(Condition_30,"43 == theStruct.SubFixList[0].SubSubVarList[0].Num",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Unmarshall.c"
                   ,"TestUnmarshallLists",0x629);
  Condition_31 = theStruct.SubFixList[0].SubSubVarList[1].Num == 0x2c;
  WjTestLib_Assert(Condition_31,"44 == theStruct.SubFixList[0].SubSubVarList[1].Num",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Unmarshall.c"
                   ,"TestUnmarshallLists",0x62a);
  WjTestLib_Assert(theStruct.SubFixList[1].SubSubFixListCount == 2,
                   "2 == theStruct.SubFixList[1].SubSubFixListCount",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Unmarshall.c"
                   ,"TestUnmarshallLists",0x62b);
  WjTestLib_Assert(theStruct.SubFixList[1].SubSubFixList[0].Num == 0x2d,
                   "45 == theStruct.SubFixList[1].SubSubFixList[0].Num",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Unmarshall.c"
                   ,"TestUnmarshallLists",0x62c);
  WjTestLib_Assert(theStruct.SubFixList[1].SubSubFixList[1].Num == 0x2e,
                   "46 == theStruct.SubFixList[1].SubSubFixList[1].Num",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Unmarshall.c"
                   ,"TestUnmarshallLists",0x62d);
  WjTestLib_Assert(theStruct.SubFixList[1].SubSubVarListCount == 2,
                   "2 == theStruct.SubFixList[1].SubSubVarListCount",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Unmarshall.c"
                   ,"TestUnmarshallLists",0x62e);
  Condition_32 = (theStruct.SubFixList[1].SubSubVarList)->Num == 0x2f;
  WjTestLib_Assert(Condition_32,"47 == theStruct.SubFixList[1].SubSubVarList[0].Num",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Unmarshall.c"
                   ,"TestUnmarshallLists",0x62f);
  Condition_33 = theStruct.SubFixList[1].SubSubVarList[1].Num == 0x30;
  WjTestLib_Assert(Condition_33,"48 == theStruct.SubFixList[1].SubSubVarList[1].Num",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Unmarshall.c"
                   ,"TestUnmarshallLists",0x630);
  Condition_34 = (theStruct.SubVarList)->SubSubFixListCount == 2;
  WjTestLib_Assert(Condition_34,"2 == theStruct.SubVarList[0].SubSubFixListCount",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Unmarshall.c"
                   ,"TestUnmarshallLists",0x632);
  Condition_35 = (theStruct.SubVarList)->SubSubFixList[0].Num == 9;
  WjTestLib_Assert(Condition_35,"9 == theStruct.SubVarList[0].SubSubFixList[0].Num",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Unmarshall.c"
                   ,"TestUnmarshallLists",0x633);
  Condition_36 = (theStruct.SubVarList)->SubSubFixList[1].Num == 10;
  WjTestLib_Assert(Condition_36,"10 == theStruct.SubVarList[0].SubSubFixList[1].Num",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Unmarshall.c"
                   ,"TestUnmarshallLists",0x634);
  Condition_37 = (theStruct.SubVarList)->SubSubVarListCount == 2;
  WjTestLib_Assert(Condition_37,"2 == theStruct.SubVarList[0].SubSubVarListCount",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Unmarshall.c"
                   ,"TestUnmarshallLists",0x635);
  Condition_38 = (theStruct.SubVarList)->SubSubVarList->Num == 0xb;
  WjTestLib_Assert(Condition_38,"11 == theStruct.SubVarList[0].SubSubVarList[0].Num",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Unmarshall.c"
                   ,"TestUnmarshallLists",0x636);
  Condition_39 = (theStruct.SubVarList)->SubSubVarList[1].Num == 0xc;
  WjTestLib_Assert(Condition_39,"12 == theStruct.SubVarList[0].SubSubVarList[1].Num",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Unmarshall.c"
                   ,"TestUnmarshallLists",0x637);
  Condition_40 = theStruct.SubVarList[1].SubSubFixListCount == 2;
  WjTestLib_Assert(Condition_40,"2 == theStruct.SubVarList[1].SubSubFixListCount",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Unmarshall.c"
                   ,"TestUnmarshallLists",0x638);
  Condition_41 = theStruct.SubVarList[1].SubSubFixList[0].Num == 0xd;
  WjTestLib_Assert(Condition_41,"13 == theStruct.SubVarList[1].SubSubFixList[0].Num",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Unmarshall.c"
                   ,"TestUnmarshallLists",0x639);
  Condition_42 = theStruct.SubVarList[1].SubSubFixList[1].Num == 0xe;
  WjTestLib_Assert(Condition_42,"14 == theStruct.SubVarList[1].SubSubFixList[1].Num",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Unmarshall.c"
                   ,"TestUnmarshallLists",0x63a);
  Condition_43 = theStruct.SubVarList[1].SubSubVarListCount == 2;
  WjTestLib_Assert(Condition_43,"2 == theStruct.SubVarList[1].SubSubVarListCount",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Unmarshall.c"
                   ,"TestUnmarshallLists",0x63b);
  Condition_44 = (theStruct.SubVarList[1].SubSubVarList)->Num == 0xf;
  WjTestLib_Assert(Condition_44,"15 == theStruct.SubVarList[1].SubSubVarList[0].Num",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Unmarshall.c"
                   ,"TestUnmarshallLists",0x63c);
  Condition_45 = theStruct.SubVarList[1].SubSubVarList[1].Num == 0x10;
  WjTestLib_Assert(Condition_45,"16 == theStruct.SubVarList[1].SubSubVarList[1].Num",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Unmarshall.c"
                   ,"TestUnmarshallLists",0x63d);
  JVar5 = JlJsonToStruct("{  \"SubFixList\":[     { \"SubSubFixList\": [{\"Num\":20}], \"SubSubVarList\": [{\"Num\":21}] }  ],  \"SubVarList\":[     { \"SubSubFixList\": [{\"Num\":22}], \"SubSubVarList\": [{\"Num\":23}] }  ]}"
                         ,marshalTheStruct,2,&theStruct,&errorAtPos);
  WjTestLib_Assert(JVar5 == JL_STATUS_SUCCESS,
                   "((JL_STATUS)(JlJsonToStruct( \"{\" \"  \\\"SubFixList\\\":[ \" \"    { \\\"SubSubFixList\\\": [{\\\"Num\\\":20}], \\\"SubSubVarList\\\": [{\\\"Num\\\":21}] }\" \"  ],\" \"  \\\"SubVarList\\\":[ \" \"    { \\\"SubSubFixList\\\": [{\\\"Num\\\":22}], \\\"SubSubVarList\\\": [{\\\"Num\\\":23}] }\" \"  ]\" \"}\", marshalTheStruct, ( sizeof(marshalTheStruct) / sizeof((marshalTheStruct)[0]) ), &theStruct, &errorAtPos ))) == (JL_STATUS_SUCCESS)"
                   ,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Unmarshall.c"
                   ,"TestUnmarshallLists",0x649);
  Condition_46 = errorAtPos == 0;
  WjTestLib_Assert(Condition_46,"0 == errorAtPos",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Unmarshall.c"
                   ,"TestUnmarshallLists",0x64b);
  WjTestLib_Assert(theStruct.SubFixListCount == 1,"1 == theStruct.SubFixListCount",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Unmarshall.c"
                   ,"TestUnmarshallLists",0x64c);
  WjTestLib_Assert(theStruct.SubFixList[0].SubSubFixListCount == 1,
                   "1 == theStruct.SubFixList[0].SubSubFixListCount",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Unmarshall.c"
                   ,"TestUnmarshallLists",0x64d);
  WjTestLib_Assert(theStruct.SubFixList[0].SubSubFixList[0].Num == 0x14,
                   "20 == theStruct.SubFixList[0].SubSubFixList[0].Num",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Unmarshall.c"
                   ,"TestUnmarshallLists",0x64e);
  WjTestLib_Assert(theStruct.SubFixList[0].SubSubVarListCount == 1,
                   "1 == theStruct.SubFixList[0].SubSubVarListCount",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Unmarshall.c"
                   ,"TestUnmarshallLists",0x64f);
  Condition_47 = (theStruct.SubFixList[0].SubSubVarList)->Num == 0x15;
  WjTestLib_Assert(Condition_47,"21 == theStruct.SubFixList[0].SubSubVarList[0].Num",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Unmarshall.c"
                   ,"TestUnmarshallLists",0x650);
  Condition_48 = (theStruct.SubVarList)->SubSubFixListCount == 1;
  WjTestLib_Assert(Condition_48,"1 == theStruct.SubVarList[0].SubSubFixListCount",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Unmarshall.c"
                   ,"TestUnmarshallLists",0x652);
  Condition_49 = (theStruct.SubVarList)->SubSubFixList[0].Num == 0x16;
  WjTestLib_Assert(Condition_49,"22 == theStruct.SubVarList[0].SubSubFixList[0].Num",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Unmarshall.c"
                   ,"TestUnmarshallLists",0x653);
  sVar2 = (theStruct.SubVarList)->SubSubVarListCount;
  WjTestLib_Assert(sVar2 == 1,"1 == theStruct.SubVarList[0].SubSubVarListCount",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Unmarshall.c"
                   ,"TestUnmarshallLists",0x654);
  uVar1 = (theStruct.SubVarList)->SubSubVarList->Num;
  WjTestLib_Assert(uVar1 == 0x17,"23 == theStruct.SubVarList[0].SubSubVarList[0].Num",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Unmarshall.c"
                   ,"TestUnmarshallLists",0x655);
  JVar6 = JlUnmarshallFreeStructAllocs(marshalTheStruct,2,&theStruct);
  WVar10 = WJTL_STATUS_SUCCESS;
  if (!Condition_06 ||
      (!Condition_05 ||
      (!Condition_04 ||
      ((!Condition_03 || (!Condition_02 || !Condition_01)) ||
      (!Condition || (!Condition_00 || JVar3 != JL_STATUS_SUCCESS)))))) {
    WVar10 = WJTL_STATUS_FAILED;
  }
  if ((!Condition_15 || !Condition_14) ||
      ((!Condition_13 || !Condition_12) ||
      (!Condition_11 || ((!Condition_10 || !Condition_09) || (!Condition_08 || !Condition_07))))) {
    WVar10 = WJTL_STATUS_FAILED;
  }
  if ((!Condition_24 || (!Condition_23 || (!Condition_22 || (!Condition_21 || !Condition_20)))) ||
      ((!Condition_19 || !Condition_18) || (!Condition_17 || !Condition_16))) {
    WVar10 = WJTL_STATUS_FAILED;
  }
  if (!Condition_31 ||
      (!Condition_30 ||
      (!Condition_29 ||
      ((theStruct.SubFixList[0].SubSubFixList[1].Num != 0x2a || (!Condition_28 || !Condition_27)) ||
      (!Condition_25 || (!Condition_26 || JVar4 != JL_STATUS_SUCCESS)))))) {
    WVar10 = WJTL_STATUS_FAILED;
  }
  if ((!Condition_36 || !Condition_35) ||
      ((!Condition_34 || !Condition_33) ||
      (!Condition_32 ||
      ((theStruct.SubFixList[1].SubSubVarListCount != 2 ||
       theStruct.SubFixList[1].SubSubFixList[1].Num != 0x2e) ||
      (theStruct.SubFixList[1].SubSubFixList[0].Num != 0x2d ||
      theStruct.SubFixList[1].SubSubFixListCount != 2))))) {
    WVar10 = WJTL_STATUS_FAILED;
  }
  if ((!Condition_45 || (!Condition_44 || (!Condition_43 || (!Condition_42 || !Condition_41)))) ||
      ((!Condition_40 || !Condition_39) || (!Condition_38 || !Condition_37))) {
    WVar10 = WJTL_STATUS_FAILED;
  }
  if ((!Condition_49 || !Condition_48) ||
      (!Condition_47 ||
      ((theStruct.SubFixList[0].SubSubVarListCount != 1 ||
       (theStruct.SubFixList[0].SubSubFixList[0].Num != 0x14 ||
       theStruct.SubFixList[0].SubSubFixListCount != 1)) ||
      (!Condition_46 || (theStruct.SubFixListCount != 1 || JVar5 != JL_STATUS_SUCCESS))))) {
    WVar10 = WJTL_STATUS_FAILED;
  }
  if (JVar6 != JL_STATUS_SUCCESS) {
    WVar10 = WJTL_STATUS_FAILED;
  }
  if (uVar1 != 0x17) {
    WVar10 = WJTL_STATUS_FAILED;
  }
  if (sVar2 != 1) {
    WVar10 = WJTL_STATUS_FAILED;
  }
  WjTestLib_Assert(JVar6 == JL_STATUS_SUCCESS,
                   "((JL_STATUS)(JlUnmarshallFreeStructAllocs( marshalTheStruct, ( sizeof(marshalTheStruct) / sizeof((marshalTheStruct)[0]) ), &theStruct ))) == (JL_STATUS_SUCCESS)"
                   ,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Unmarshall.c"
                   ,"TestUnmarshallLists",0x658);
  return WVar10;
}

Assistant:

static
WJTL_STATUS
    TestUnmarshallLists
    (
        void
    )
{
    WJTL_STATUS TestReturn = WJTL_STATUS_SUCCESS;
    size_t errorAtPos = 0;

    typedef struct
    {
        uint32_t        Num;
    } SubSubStruct;

    typedef struct
    {
        SubSubStruct   SubSubFixList [4];
        size_t         SubSubFixListCount;
        SubSubStruct*  SubSubVarList;
        size_t         SubSubVarListCount;
    } SubStruct;

    typedef struct
    {
        SubStruct   SubFixList [4];
        size_t      SubFixListCount;
        SubStruct*  SubVarList;
        size_t      SubVarListCount;
    } TheStruct;

    JlMarshallElement marshalSubSubStruct[] = {
        JlMarshallUnsigned( SubSubStruct, Num, "Num" )
    };

    JlMarshallElement marshalSubStruct[] = {
        JlMarshallStructFixedArray( SubStruct, SubSubFixList, SubSubFixListCount, "SubSubFixList", SubSubStruct, marshalSubSubStruct, NumElements(marshalSubSubStruct) ),
        JlMarshallStructArray( SubStruct, SubSubVarList, SubSubVarListCount, "SubSubVarList", SubSubStruct, marshalSubSubStruct, NumElements(marshalSubSubStruct) )
    };

    JlMarshallElement marshalTheStruct[] = {
        JlMarshallStructFixedArray( TheStruct, SubFixList, SubFixListCount, "SubFixList", SubStruct, marshalSubStruct, NumElements(marshalSubStruct) ),
        JlMarshallStructArray( TheStruct, SubVarList, SubVarListCount, "SubVarList", SubStruct, marshalSubStruct, NumElements(marshalSubStruct) )
    };

    TheStruct theStruct = {{{{{0}}}}};

    // Fill in struct with values
    JL_ASSERT_SUCCESS( JlJsonToStruct(
        "{"
        "  \"SubFixList\":[ "
        "    { \"SubSubFixList\": [{\"Num\":1},{\"Num\":2}], \"SubSubVarList\": [{\"Num\":3},{\"Num\":4}] },"
        "    { \"SubSubFixList\": [{\"Num\":5},{\"Num\":6}], \"SubSubVarList\": [{\"Num\":7},{\"Num\":8}] }"
        "  ],"
        "  \"SubVarList\":[ "
        "    { \"SubSubFixList\": [{\"Num\":9},{\"Num\":10}], \"SubSubVarList\": [{\"Num\":11},{\"Num\":12}] },"
        "    { \"SubSubFixList\": [{\"Num\":13},{\"Num\":14}], \"SubSubVarList\": [{\"Num\":15},{\"Num\":16}] }"
        "  ]"
        "}",
        marshalTheStruct, NumElements(marshalTheStruct), &theStruct, &errorAtPos ) );

    JL_ASSERT( 0 == errorAtPos );
    JL_ASSERT( 2 == theStruct.SubFixListCount );
      JL_ASSERT( 2 == theStruct.SubFixList[0].SubSubFixListCount );
        JL_ASSERT( 1 == theStruct.SubFixList[0].SubSubFixList[0].Num );
        JL_ASSERT( 2 == theStruct.SubFixList[0].SubSubFixList[1].Num );
      JL_ASSERT( 2 == theStruct.SubFixList[0].SubSubVarListCount );
        JL_ASSERT( 3 == theStruct.SubFixList[0].SubSubVarList[0].Num );
        JL_ASSERT( 4 == theStruct.SubFixList[0].SubSubVarList[1].Num );
      JL_ASSERT( 2 == theStruct.SubFixList[1].SubSubFixListCount );
        JL_ASSERT( 5 == theStruct.SubFixList[1].SubSubFixList[0].Num );
        JL_ASSERT( 6 == theStruct.SubFixList[1].SubSubFixList[1].Num );
      JL_ASSERT( 2 == theStruct.SubFixList[1].SubSubVarListCount );
        JL_ASSERT( 7 == theStruct.SubFixList[1].SubSubVarList[0].Num );
        JL_ASSERT( 8 == theStruct.SubFixList[1].SubSubVarList[1].Num );

      JL_ASSERT( 2 == theStruct.SubVarList[0].SubSubFixListCount );
        JL_ASSERT( 9 == theStruct.SubVarList[0].SubSubFixList[0].Num );
        JL_ASSERT( 10 == theStruct.SubVarList[0].SubSubFixList[1].Num );
      JL_ASSERT( 2 == theStruct.SubVarList[0].SubSubVarListCount );
        JL_ASSERT( 11 == theStruct.SubVarList[0].SubSubVarList[0].Num );
        JL_ASSERT( 12 == theStruct.SubVarList[0].SubSubVarList[1].Num );
      JL_ASSERT( 2 == theStruct.SubVarList[1].SubSubFixListCount );
        JL_ASSERT( 13 == theStruct.SubVarList[1].SubSubFixList[0].Num );
        JL_ASSERT( 14 == theStruct.SubVarList[1].SubSubFixList[1].Num );
      JL_ASSERT( 2 == theStruct.SubVarList[1].SubSubVarListCount );
        JL_ASSERT( 15 == theStruct.SubVarList[1].SubSubVarList[0].Num );
        JL_ASSERT( 16 == theStruct.SubVarList[1].SubSubVarList[1].Num );

    // Partial replace
    JL_ASSERT_SUCCESS( JlJsonToStruct(
        "{"
        "  \"SubFixList\":[ "
        "    { \"SubSubFixList\": [{\"Num\":41},{\"Num\":42}], \"SubSubVarList\": [{\"Num\":43},{\"Num\":44}] },"
        "    { \"SubSubFixList\": [{\"Num\":45},{\"Num\":46}], \"SubSubVarList\": [{\"Num\":47},{\"Num\":48}] }"
        "  ]"
        "}",
        marshalTheStruct, NumElements(marshalTheStruct), &theStruct, &errorAtPos ) );

    JL_ASSERT( 0 == errorAtPos );
    JL_ASSERT( 2 == theStruct.SubFixListCount );
      JL_ASSERT( 2 == theStruct.SubFixList[0].SubSubFixListCount );
        JL_ASSERT( 41 == theStruct.SubFixList[0].SubSubFixList[0].Num );
        JL_ASSERT( 42 == theStruct.SubFixList[0].SubSubFixList[1].Num );
      JL_ASSERT( 2 == theStruct.SubFixList[0].SubSubVarListCount );
        JL_ASSERT( 43 == theStruct.SubFixList[0].SubSubVarList[0].Num );
        JL_ASSERT( 44 == theStruct.SubFixList[0].SubSubVarList[1].Num );
      JL_ASSERT( 2 == theStruct.SubFixList[1].SubSubFixListCount );
        JL_ASSERT( 45 == theStruct.SubFixList[1].SubSubFixList[0].Num );
        JL_ASSERT( 46 == theStruct.SubFixList[1].SubSubFixList[1].Num );
      JL_ASSERT( 2 == theStruct.SubFixList[1].SubSubVarListCount );
        JL_ASSERT( 47 == theStruct.SubFixList[1].SubSubVarList[0].Num );
        JL_ASSERT( 48 == theStruct.SubFixList[1].SubSubVarList[1].Num );
      // Rest should be same from before
      JL_ASSERT( 2 == theStruct.SubVarList[0].SubSubFixListCount );
        JL_ASSERT( 9 == theStruct.SubVarList[0].SubSubFixList[0].Num );
        JL_ASSERT( 10 == theStruct.SubVarList[0].SubSubFixList[1].Num );
      JL_ASSERT( 2 == theStruct.SubVarList[0].SubSubVarListCount );
        JL_ASSERT( 11 == theStruct.SubVarList[0].SubSubVarList[0].Num );
        JL_ASSERT( 12 == theStruct.SubVarList[0].SubSubVarList[1].Num );
      JL_ASSERT( 2 == theStruct.SubVarList[1].SubSubFixListCount );
        JL_ASSERT( 13 == theStruct.SubVarList[1].SubSubFixList[0].Num );
        JL_ASSERT( 14 == theStruct.SubVarList[1].SubSubFixList[1].Num );
      JL_ASSERT( 2 == theStruct.SubVarList[1].SubSubVarListCount );
        JL_ASSERT( 15 == theStruct.SubVarList[1].SubSubVarList[0].Num );
        JL_ASSERT( 16 == theStruct.SubVarList[1].SubSubVarList[1].Num );

    // Replace with some values
    JL_ASSERT_SUCCESS( JlJsonToStruct(
        "{"
        "  \"SubFixList\":[ "
        "    { \"SubSubFixList\": [{\"Num\":20}], \"SubSubVarList\": [{\"Num\":21}] }"
        "  ],"
        "  \"SubVarList\":[ "
        "    { \"SubSubFixList\": [{\"Num\":22}], \"SubSubVarList\": [{\"Num\":23}] }"
        "  ]"
        "}",
        marshalTheStruct, NumElements(marshalTheStruct), &theStruct, &errorAtPos ) );

    JL_ASSERT( 0 == errorAtPos );
    JL_ASSERT( 1 == theStruct.SubFixListCount );
      JL_ASSERT( 1 == theStruct.SubFixList[0].SubSubFixListCount );
        JL_ASSERT( 20 == theStruct.SubFixList[0].SubSubFixList[0].Num );
      JL_ASSERT( 1 == theStruct.SubFixList[0].SubSubVarListCount );
        JL_ASSERT( 21 == theStruct.SubFixList[0].SubSubVarList[0].Num );

      JL_ASSERT( 1 == theStruct.SubVarList[0].SubSubFixListCount );
        JL_ASSERT( 22 == theStruct.SubVarList[0].SubSubFixList[0].Num );
      JL_ASSERT( 1 == theStruct.SubVarList[0].SubSubVarListCount );
        JL_ASSERT( 23 == theStruct.SubVarList[0].SubSubVarList[0].Num );

    // Free and make sure no memory leak
    JL_ASSERT_SUCCESS( JlUnmarshallFreeStructAllocs( marshalTheStruct, NumElements(marshalTheStruct), &theStruct ) );

    return TestReturn;
}